

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::peer_blocked_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_blocked_alert *this)

{
  char ret [600];
  string local_298;
  char local_278 [608];
  
  peer_alert::message_abi_cxx11_(&local_298,&this->super_peer_alert);
  snprintf(local_278,600,"%s: blocked peer [%s]",local_298._M_dataplus._M_p,
           _ZZNK10libtorrent18peer_blocked_alert7messageB5cxx11EvE10reason_str_rel +
           *(int *)(_ZZNK10libtorrent18peer_blocked_alert7messageB5cxx11EvE10reason_str_rel +
                   (long)*(int *)&(this->super_peer_alert).field_0x9c * 4));
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_278,(allocator<char> *)&local_298);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_blocked_alert::message() const
	{
		char ret[600];
		static char const* const reason_str[] =
		{
			"ip_filter",
			"port_filter",
			"i2p_mixed",
			"privileged_ports",
			"utp_disabled",
			"tcp_disabled",
			"invalid_local_interface"
		};

		std::snprintf(ret, sizeof(ret), "%s: blocked peer [%s]"
			, peer_alert::message().c_str(), reason_str[reason]);
		return ret;
	}